

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_get.c
# Opt level: O1

int mpt_config_get(mpt_config *conf,char *dest,mpt_type_t type,void *ptr)

{
  int iVar1;
  code *cb;
  mpt_path path;
  mpt_path local_48;
  void *local_28;
  mpt_type_t local_20;
  
  local_48.len = 0;
  local_48.first = '\0';
  local_48.flags = '\0';
  local_48.sep = '.';
  local_48.assign = '\0';
  local_48._28_4_ = 0;
  local_48.base = (char *)0x0;
  local_48.off = 0;
  if (dest != (char *)0x0) {
    local_48.first = '\0';
    local_48.flags = '\0';
    local_48.sep = '.';
    local_48.assign = '\0';
    local_48._28_4_ = 0;
    mpt_path_set(&local_48,dest,-1);
  }
  cb = _convert_value;
  if (type == 0) {
    cb = (mpt_config_handler_t *)0x0;
  }
  local_28 = ptr;
  local_20 = type;
  iVar1 = mpt_config_query(conf,&local_48,cb,&local_28);
  return iVar1;
}

Assistant:

extern int mpt_config_get(const MPT_INTERFACE(config) *conf, const char *dest, MPT_TYPE(type) type, void *ptr)
{
	MPT_STRUCT(path) path = MPT_PATH_INIT;
	if (dest) {
		path.sep = '.';
		path.assign = 0;
		mpt_path_set(&path, dest, -1);
	}
	return mpt_config_getp(conf, &path, type, ptr);
}